

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_connection.cc
# Opt level: O3

bool __thiscall iqnet::ssl::Reaction_connection::reg_shutdown(Reaction_connection *this)

{
  uint uVar1;
  _func_int **pp_Var2;
  undefined8 uVar3;
  Reactor_base *pRVar4;
  
  this->state = SHUTDOWN;
  uVar1 = SSL_get_shutdown((SSL *)(this->super_Connection).ssl);
  if ((uVar1 & 1) == 0) {
    pRVar4 = this->reactor;
    pp_Var2 = pRVar4->_vptr_Reactor_base;
    uVar3 = 2;
  }
  else {
    uVar1 = SSL_get_shutdown((SSL *)(this->super_Connection).ssl);
    if ((uVar1 & 2) != 0) {
      this->state = EMPTY;
      return true;
    }
    pRVar4 = this->reactor;
    pp_Var2 = pRVar4->_vptr_Reactor_base;
    uVar3 = 1;
  }
  (*pp_Var2[2])(pRVar4,this,uVar3);
  return false;
}

Assistant:

bool ssl::Reaction_connection::reg_shutdown()
{
  state = SHUTDOWN;

  if( !shutdown_sent() )
  {
    reactor->register_handler( this, Reactor_base::OUTPUT );
  }
  else if( !shutdown_recved() )
  {
    reactor->register_handler( this, Reactor_base::INPUT );
  }
  else
  {
    state = EMPTY;
    return true;
  }

  return false;
}